

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O1

void __thiscall QRingBuffer::free(QRingBuffer *this,void *__ptr)

{
  QRingChunk *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  bool bVar4;
  long lVar5;
  iterator iVar6;
  bool bVar7;
  
  do {
    if ((long)__ptr < 1) {
      return;
    }
    pQVar1 = (this->buffers).d.ptr;
    lVar5 = pQVar1->tailOffset - pQVar1->headOffset;
    bVar7 = (this->buffers).d.size != 1;
    bVar4 = lVar5 <= (long)__ptr;
    if (bVar4 && bVar7) {
      this->bufferSize = this->bufferSize - lVar5;
      pDVar2 = (this->buffers).d.d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
         )) {
        QArrayDataPointer<QRingChunk>::reallocateAndGrow
                  ((QArrayDataPointer<QRingChunk> *)this,GrowsAtEnd,0,
                   (QArrayDataPointer<QRingChunk> *)0x0);
      }
      QtPrivate::QGenericArrayOps<QRingChunk>::eraseFirst((QGenericArrayOps<QRingChunk> *)this);
      __ptr = (void *)((long)__ptr - lVar5);
    }
    else {
      iVar6 = QList<QRingChunk>::begin(&this->buffers);
      lVar5 = this->bufferSize - (long)__ptr;
      if (lVar5 == 0) {
        if ((((long)this->basicBlockSize < ((iVar6.i)->chunk).d.size) ||
            (pDVar3 = ((iVar6.i)->chunk).d.d, pDVar3 == (Data *)0x0)) ||
           ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>
            != 1)) {
          clear(this);
        }
        else {
          (iVar6.i)->headOffset = 0;
          (iVar6.i)->tailOffset = 0;
          this->bufferSize = 0;
        }
      }
      else {
        (iVar6.i)->headOffset = (iVar6.i)->headOffset + (long)__ptr;
        this->bufferSize = lVar5;
      }
    }
  } while (bVar4 && bVar7);
  return;
}

Assistant:

void QRingBuffer::free(qint64 bytes)
{
    Q_ASSERT(bytes <= bufferSize);

    while (bytes > 0) {
        const qint64 chunkSize = buffers.constFirst().size();

        if (buffers.size() == 1 || chunkSize > bytes) {
            QRingChunk &chunk = buffers.first();
            // keep a single block around if it does not exceed
            // the basic block size, to avoid repeated allocations
            // between uses of the buffer
            if (bufferSize == bytes) {
                if (chunk.capacity() <= basicBlockSize && !chunk.isShared()) {
                    chunk.reset();
                    bufferSize = 0;
                } else {
                    clear(); // try to minify/squeeze us
                }
            } else {
                Q_ASSERT(bytes < QByteArray::maxSize());
                chunk.advance(bytes);
                bufferSize -= bytes;
            }
            return;
        }

        bufferSize -= chunkSize;
        bytes -= chunkSize;
        buffers.removeFirst();
    }
}